

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPathIdentifier(AsciiParser *this,string *path_identifier)

{
  bool bVar1;
  string local_1f0;
  string local_1d0;
  char local_1ae;
  byte local_1ad;
  undefined4 local_1ac;
  stringstream local_1a8 [2];
  char c;
  bool ok;
  stringstream ss;
  ostream aoStack_198 [376];
  string *local_20;
  string *path_identifier_local;
  AsciiParser *this_local;
  
  local_20 = path_identifier;
  path_identifier_local = (string *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = Expect(this,'<');
  if (bVar1) {
    bVar1 = SkipWhitespace(this);
    if (bVar1) {
      local_1ad = 0;
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = Char1(this,&local_1ae);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0054dbad;
        }
        if (local_1ae == '>') {
          local_1ad = 1;
          (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
          break;
        }
        ::std::operator<<(aoStack_198,local_1ae);
      }
      if ((local_1ad & 1) == 0) {
        this_local._7_1_ = 0;
      }
      else {
        ::std::__cxx11::stringstream::str();
        anon_unknown_4::TrimString(&local_1d0,&local_1f0);
        ::std::__cxx11::string::operator=((string *)local_20,(string *)&local_1d0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        this_local._7_1_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0054dbad:
  local_1ac = 1;
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadPathIdentifier(std::string *path_identifier) {
  // path_identifier = `<` string `>`
  std::stringstream ss;

  if (!Expect('<')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  // read until '>'
  bool ok = false;
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '>') {
      // end
      ok = true;
      _curr_cursor.col++;
      break;
    }

    // TODO: Check if character is valid for path identifier
    ss << c;
  }

  if (!ok) {
    return false;
  }

  (*path_identifier) = TrimString(ss.str());
  // std::cout << "PathIdentifier: " << (*path_identifier) << "\n";

  return true;
}